

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gena_ctrlpt.c
# Opt level: O0

int genaSubscribe(UpnpClient_Handle client_handle,UpnpString *PublisherURL,int *TimeOut,
                 UpnpString *out_sid)

{
  Upnp_Handle_Type UVar1;
  uint uVar2;
  GenlibClientSubscription *p;
  Handle_Info *pHStack_c0;
  int rc;
  Handle_Info *handle_info;
  UpnpString *EventURL;
  UpnpString *ActualSID;
  Upnp_SID temp_sid2;
  Upnp_SID temp_sid;
  uuid_upnp uid;
  GenlibClientSubscription *newSubscription;
  int return_code;
  UpnpString *out_sid_local;
  int *TimeOut_local;
  UpnpString *PublisherURL_local;
  UpnpClient_Handle client_handle_local;
  
  p = GenlibClientSubscription_new();
  EventURL = UpnpString_new();
  handle_info = (Handle_Info *)UpnpString_new();
  memset(temp_sid2 + 0x28,0,0x2c);
  memset(&ActualSID,0,0x2c);
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x24b,"GENA SUBSCRIBE BEGIN\n");
  UpnpString_clear(out_sid);
  HandleReadLock(".upnp/src/gena/gena_ctrlpt.c",0x24f);
  UVar1 = GetHandleInfo(client_handle,&stack0xffffffffffffff40);
  if (UVar1 == HND_CLIENT) {
    HandleUnlock(".upnp/src/gena/gena_ctrlpt.c",0x256);
    UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x259,"Trying Subscribe Lock");
    pthread_mutex_lock((pthread_mutex_t *)&GlobalClientSubscribeMutex);
    UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x259,"Subscribe Lock");
    newSubscription._4_4_ = gena_subscribe(PublisherURL,TimeOut,(UpnpString *)0x0,EventURL);
    HandleLock(".upnp/src/gena/gena_ctrlpt.c",0x25b);
    if (newSubscription._4_4_ == 0) {
      UVar1 = GetHandleInfo(client_handle,&stack0xffffffffffffff40);
      if (UVar1 == HND_CLIENT) {
        uuid_create((uuid_upnp *)(temp_sid + 0x28));
        upnp_uuid_unpack((uuid_upnp *)(temp_sid + 0x28),temp_sid2 + 0x28);
        uVar2 = snprintf((char *)&ActualSID,0x2c,"uuid:%s",temp_sid2 + 0x28);
        if (((int)uVar2 < 0) || (0x2b < uVar2)) {
          newSubscription._4_4_ = 0xffffff98;
        }
        else {
          UpnpString_set_String(out_sid,(char *)&ActualSID);
          UpnpString_assign((UpnpString *)handle_info,PublisherURL);
          if (p == (GenlibClientSubscription *)0x0) {
            newSubscription._4_4_ = 0xffffff98;
          }
          else {
            GenlibClientSubscription_set_RenewEventId(p,-1);
            GenlibClientSubscription_set_SID(p,out_sid);
            GenlibClientSubscription_set_ActualSID(p,EventURL);
            GenlibClientSubscription_set_EventURL(p,(UpnpString *)handle_info);
            GenlibClientSubscription_set_Next(p,pHStack_c0->ClientSubList);
            pHStack_c0->ClientSubList = p;
            newSubscription._4_4_ = ScheduleGenaAutoRenew(client_handle,*TimeOut,p);
          }
        }
      }
      else {
        newSubscription._4_4_ = 0xffffff9c;
      }
    }
    else {
      UpnpPrintf(UPNP_CRITICAL,GENA,".upnp/src/gena/gena_ctrlpt.c",0x260,
                 "SUBSCRIBE FAILED in transfer error code: %d returned\n",
                 (ulong)newSubscription._4_4_);
    }
  }
  else {
    newSubscription._4_4_ = 0xffffff9c;
    UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x253,"Trying Subscribe Lock");
    pthread_mutex_lock((pthread_mutex_t *)&GlobalClientSubscribeMutex);
    UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x253,"Subscribe Lock");
  }
  UpnpString_delete(EventURL);
  UpnpString_delete((UpnpString *)handle_info);
  if (newSubscription._4_4_ != 0) {
    GenlibClientSubscription_delete(p);
  }
  HandleUnlock(".upnp/src/gena/gena_ctrlpt.c",0x28f);
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x290,"Trying Subscribe UnLock");
  pthread_mutex_unlock((pthread_mutex_t *)&GlobalClientSubscribeMutex);
  UpnpPrintf(UPNP_INFO,GENA,".upnp/src/gena/gena_ctrlpt.c",0x290,"Subscribe UnLock");
  return newSubscription._4_4_;
}

Assistant:

int genaSubscribe(UpnpClient_Handle client_handle,
	const UpnpString *PublisherURL,
	int *TimeOut,
	UpnpString *out_sid)
{
	int return_code = GENA_SUCCESS;
	GenlibClientSubscription *newSubscription =
		GenlibClientSubscription_new();
	uuid_upnp uid;
	Upnp_SID temp_sid;
	Upnp_SID temp_sid2;
	UpnpString *ActualSID = UpnpString_new();
	UpnpString *EventURL = UpnpString_new();
	struct Handle_Info *handle_info;
	int rc = 0;

	memset(temp_sid, 0, sizeof(temp_sid));
	memset(temp_sid2, 0, sizeof(temp_sid2));

	UpnpPrintf(
		UPNP_INFO, GENA, __FILE__, __LINE__, "GENA SUBSCRIBE BEGIN\n");

	UpnpString_clear(out_sid);

	HandleReadLock(__FILE__, __LINE__);
	/* validate handle */
	if (GetHandleInfo(client_handle, &handle_info) != HND_CLIENT) {
		return_code = GENA_E_BAD_HANDLE;
		SubscribeLock();
		goto error_handler;
	}
	HandleUnlock(__FILE__, __LINE__);

	/* subscribe */
	SubscribeLock();
	return_code = gena_subscribe(PublisherURL, TimeOut, NULL, ActualSID);
	HandleLock(__FILE__, __LINE__);
	if (return_code != UPNP_E_SUCCESS) {
		UpnpPrintf(UPNP_CRITICAL,
			GENA,
			__FILE__,
			__LINE__,
			"SUBSCRIBE FAILED in transfer error code: %d "
			"returned\n",
			return_code);
		goto error_handler;
	}

	if (GetHandleInfo(client_handle, &handle_info) != HND_CLIENT) {
		return_code = GENA_E_BAD_HANDLE;
		goto error_handler;
	}

	/* generate client SID */
	uuid_create(&uid);
	upnp_uuid_unpack(&uid, temp_sid);
	rc = snprintf(temp_sid2, sizeof(temp_sid2), "uuid:%s", temp_sid);
	if (rc < 0 || (unsigned int)rc >= sizeof(temp_sid2)) {
		return_code = UPNP_E_OUTOF_MEMORY;
		goto error_handler;
	}
	UpnpString_set_String(out_sid, temp_sid2);

	/* create event url */
	UpnpString_assign(EventURL, PublisherURL);

	/* fill subscription */
	if (newSubscription == NULL) {
		return_code = UPNP_E_OUTOF_MEMORY;
		goto error_handler;
	}
	GenlibClientSubscription_set_RenewEventId(newSubscription, -1);
	GenlibClientSubscription_set_SID(newSubscription, out_sid);
	GenlibClientSubscription_set_ActualSID(newSubscription, ActualSID);
	GenlibClientSubscription_set_EventURL(newSubscription, EventURL);
	GenlibClientSubscription_set_Next(
		newSubscription, handle_info->ClientSubList);
	handle_info->ClientSubList = newSubscription;

	/* schedule expiration event */
	return_code =
		ScheduleGenaAutoRenew(client_handle, *TimeOut, newSubscription);

error_handler:
	UpnpString_delete(ActualSID);
	UpnpString_delete(EventURL);
	if (return_code != UPNP_E_SUCCESS)
		GenlibClientSubscription_delete(newSubscription);
	HandleUnlock(__FILE__, __LINE__);
	SubscribeUnlock();

	return return_code;
}